

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qibusproxy.h
# Opt level: O0

QDBusError * __thiscall QIBusProxy::GetProperty(QIBusProxy *this,QString *method)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  QDBusMessage *this_00;
  QString *in_RDX;
  QDBusError *in_RDI;
  long in_FS_OFFSET;
  char16_t *str;
  QDBusMessage msg;
  DataPointer *in_stack_fffffffffffffe38;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffe40;
  bool local_18b;
  QDBusConnection local_158 [8];
  undefined1 local_150 [24];
  QArrayDataPointer<char16_t> local_138 [2];
  undefined1 local_108 [24];
  undefined1 local_f0 [24];
  undefined1 local_d8 [24];
  undefined8 local_c0 [15];
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = QDBusAbstractInterface::isValid();
  bVar2 = false;
  bVar1 = false;
  local_18b = true;
  if ((bVar3 & 1) != 0) {
    QDBusAbstractInterface::service();
    bVar2 = true;
    bVar4 = QString::isEmpty((QString *)0x12d849);
    local_18b = true;
    if (!bVar4) {
      QDBusAbstractInterface::path();
      bVar1 = true;
      local_18b = QString::isEmpty((QString *)0x12d87a);
    }
  }
  if (bVar1) {
    QString::~QString((QString *)0x12d89c);
  }
  if (bVar2) {
    QString::~QString((QString *)0x12d8b2);
  }
  if (local_18b == false) {
    local_c0[0] = 0xaaaaaaaaaaaaaaaa;
    QDBusAbstractInterface::service();
    QDBusAbstractInterface::path();
    dbusInterfaceProperties();
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_138,(Data *)0x0,L"Get",3);
    QString::QString((QString *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    QDBusMessage::createMethodCall
              ((QString *)local_c0,(QString *)local_d8,(QString *)local_f0,(QString *)local_108);
    QString::~QString((QString *)0x12d9bf);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffe40);
    QString::~QString((QString *)0x12d9d9);
    QString::~QString((QString *)0x12d9e6);
    QString::~QString((QString *)0x12d9f3);
    QDBusAbstractInterface::interface();
    QVariant::QVariant(&local_28,(QString *)local_150);
    this_00 = (QDBusMessage *)
              QDBusMessage::operator<<((QDBusMessage *)local_c0,(QVariant *)&local_28);
    QVariant::QVariant(&local_48,in_RDX);
    QDBusMessage::operator<<(this_00,(QVariant *)&local_48);
    QVariant::~QVariant(&local_48);
    QVariant::~QVariant(&local_28);
    QString::~QString((QString *)0x12da76);
    QDBusAbstractInterface::connection();
    QDBusAbstractInterface::timeout();
    QDBusConnection::asyncCall((QDBusMessage *)in_RDI,(int)local_158);
    QDBusConnection::~QDBusConnection(local_158);
    QDBusMessage::~QDBusMessage((QDBusMessage *)local_c0);
  }
  else {
    QDBusAbstractInterface::lastError();
    QDBusPendingCall::fromError(in_RDI);
    QDBusError::~QDBusError((QDBusError *)in_stack_fffffffffffffe40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

inline QDBusPendingCall GetProperty(const QString method)
    {
        if (!this->isValid() || this->service().isEmpty() || this->path().isEmpty())
             return QDBusPendingCall::fromError(this->lastError());

        QDBusMessage msg = QDBusMessage::createMethodCall(this->service(),
                                                          this->path(),
                                                          dbusInterfaceProperties(),
                                                          QStringLiteral("Get"));
        msg << this->interface() << method;
        return this->connection().asyncCall(msg, this->timeout());
    }